

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadCord(CodedInputStream *this,Cord *output,int size)

{
  int iVar1;
  Nullable<const_char_*> failure_msg;
  int iVar2;
  string_view src;
  Cord *local_40;
  LogMessage local_38;
  
  local_38.errno_saver_.saved_errno_ = 0;
  local_38._4_4_ = 0;
  local_40 = output;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<absl::lts_20250127::Cord*,decltype(nullptr)>
                          (&local_40,(void **)&local_38,"output != nullptr");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x134,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  if (size < 0) {
    absl::lts_20250127::Cord::Clear(local_40);
  }
  else {
    if (((uint)size < 0x200) || (this->input_ == (ZeroCopyInputStream *)0x0)) {
      iVar2 = *(int *)&this->buffer_end_ - (int)this->buffer_;
      iVar1 = size;
      if (iVar2 < size) {
        iVar1 = iVar2;
      }
      src._M_str = (char *)this->buffer_;
      src._M_len = (long)iVar1;
      absl::lts_20250127::Cord::operator=(local_40,src);
      this->buffer_ = this->buffer_ + iVar1;
      if (size <= iVar2) {
        return true;
      }
      if (this->input_ == (ZeroCopyInputStream *)0x0) {
        return false;
      }
      iVar2 = this->overflow_bytes_ + this->buffer_size_after_limit_;
      if (iVar2 != 0 && SCARRY4(this->overflow_bytes_,this->buffer_size_after_limit_) == iVar2 < 0)
      {
        return false;
      }
      size = size - iVar1;
    }
    else {
      absl::lts_20250127::Cord::Clear(local_40);
      BackUpInputToCurrentPosition(this);
    }
    iVar1 = this->current_limit_;
    if (this->total_bytes_limit_ < this->current_limit_) {
      iVar1 = this->total_bytes_limit_;
    }
    if (size <= iVar1 - this->total_bytes_read_) {
      this->total_bytes_read_ = this->total_bytes_read_ + size;
      iVar1 = (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,local_40,(ulong)(uint)size)
      ;
      return (bool)(char)iVar1;
    }
    this->total_bytes_read_ = iVar1;
    (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,local_40);
  }
  return false;
}

Assistant:

bool CodedInputStream::ReadCord(absl::Cord* output, int size) {
  ABSL_DCHECK_NE(output, nullptr);

  // security: size is often user-supplied
  if (size < 0) {
    output->Clear();
    return false;  // security: size is often user-supplied
  }

  // Grab whatever is in the current output if `size` is relatively small,
  // or if we are not sourcing data from an input stream.
  if (input_ == nullptr || size < kMaxCordBytesToCopy) {
    // Just copy the current buffer into the output rather than backing up.
    absl::string_view buffer(reinterpret_cast<const char*>(buffer_),
                             static_cast<size_t>(std::min(size, BufferSize())));
    *output = buffer;
    Advance(static_cast<int>(buffer.size()));
    size -= static_cast<int>(buffer.size());
    if (size == 0) return true;
    if (input_ == nullptr || buffer_size_after_limit_ + overflow_bytes_ > 0) {
      // We hit a limit.
      return false;
    }
  } else {
    output->Clear();
    BackUpInputToCurrentPosition();
  }

  // Make sure to not cross a limit set by PushLimit() or SetTotalBytesLimit().
  const int closest_limit = std::min(current_limit_, total_bytes_limit_);
  const int available = closest_limit - total_bytes_read_;
  if (ABSL_PREDICT_FALSE(size > available)) {
    total_bytes_read_ = closest_limit;
    input_->ReadCord(output, available);
    return false;
  }
  total_bytes_read_ += size;
  return input_->ReadCord(output, size);
}